

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  Data *pDVar5;
  FieldDescriptor *local_100;
  FieldDescriptor *field;
  MessageSetParser *pMStack_f0;
  int field_number;
  undefined1 *local_e8;
  uint local_dc;
  ParseContext *pPStack_d8;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageSetParser *this_local;
  undefined1 local_b8 [16];
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  string *local_90;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_78 [16];
  LogMessageFatal local_68 [23];
  Voidify local_51;
  string *local_50;
  string *absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint local_34;
  ParseContext *local_30;
  ParseContext *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  undefined1 *local_10;
  
  pPStack_d8 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    bVar1 = ParseContext::Done(pPStack_d8,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)ReadTag((char *)ctx_local,&local_dc,0);
    this_00 = pPStack_d8;
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    if ((local_dc == 0) || ((local_dc & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&pPStack_d8->super_EpsCopyInputStream,local_dc);
      return (char *)ctx_local;
    }
    if (local_dc == 0xb) {
      local_e8 = (undefined1 *)&stack0xffffffffffffff28;
      local_28 = pPStack_d8;
      local_34 = local_dc;
      _old_group_depth = (undefined1 *)&stack0xffffffffffffff10;
      iVar2 = pPStack_d8->depth_ + -1;
      pPStack_d8->depth_ = iVar2;
      pMStack_f0 = this;
      local_30 = ctx_local;
      if (iVar2 < 0) {
        local_20 = (ParseContext *)0x0;
      }
      else {
        pPStack_d8->group_depth_ = pPStack_d8->group_depth_ + 1;
        absl_log_internal_check_op_result._4_4_ = pPStack_d8->depth_;
        absl_log_internal_check_op_result._0_4_ = pPStack_d8->group_depth_;
        local_18 = ctx_local;
        local_10 = _old_group_depth;
        local_30 = (ParseContext *)ParseElement(this,(char *)ctx_local,pPStack_d8);
        if (local_30 != (ParseContext *)0x0) {
          iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                            (absl_log_internal_check_op_result._4_4_);
          iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this_00->depth_);
          local_50 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                               (iVar2,iVar3,"old_depth == depth_");
          if (local_50 != (string *)0x0) {
            local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                       ,0x45b,local_78._0_8_,local_78._8_8_);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_68);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar4);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
          }
          iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                            ((int)absl_log_internal_check_op_result);
          iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this_00->group_depth_);
          local_90 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                               (iVar2,iVar3,"old_group_depth == group_depth_");
          if (local_90 != (string *)0x0) {
            local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                       ,0x45c,local_b8._0_8_,local_b8._8_8_);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_a8);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar4);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
          }
          local_90 = (string *)0x0;
        }
        this_00->group_depth_ = this_00->group_depth_ + -1;
        this_00->depth_ = this_00->depth_ + 1;
        bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this_00->super_EpsCopyInputStream,local_34);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_20 = local_30;
        }
        else {
          local_20 = (ParseContext *)0x0;
        }
      }
      ctx_local = local_20;
    }
    else {
      iVar2 = WireFormatLite::GetTagFieldNumber(local_dc);
      local_100 = (FieldDescriptor *)0x0;
      bVar1 = Descriptor::IsExtensionNumber(this->descriptor,iVar2);
      if (bVar1) {
        pDVar5 = ParseContext::data(pPStack_d8);
        if (pDVar5->pool == (DescriptorPool *)0x0) {
          local_100 = Reflection::FindKnownExtensionByNumber(this->reflection,iVar2);
        }
        else {
          pDVar5 = ParseContext::data(pPStack_d8);
          local_100 = DescriptorPool::FindExtensionByNumber(pDVar5->pool,this->descriptor,iVar2);
        }
      }
      ctx_local = (ParseContext *)
                  _InternalParseAndMergeField
                            (this->msg,(char *)ctx_local,pPStack_d8,(ulong)local_dc,this->reflection
                             ,local_100);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }